

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall V2Transport::V2Transport(V2Transport *this,NodeId nodeid,bool initiating)

{
  Span<const_std::byte> ent32;
  byte *in_RSI;
  CKey *in_RDI;
  long in_FS_OFFSET;
  CKey *this_00;
  bool in_stack_ffffffffffffff57;
  uint256 *v;
  undefined1 initiating_00;
  V2Transport *this_01;
  byte *pbVar1;
  CKey *pCVar2;
  CKey local_50;
  undefined1 local_38 [8];
  undefined8 in_stack_ffffffffffffffd0;
  undefined8 local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (V2Transport *)local_38;
  pbVar1 = in_RSI;
  pCVar2 = in_RDI;
  GenerateRandomKey(in_stack_ffffffffffffff57);
  initiating_00 = (undefined1)((ulong)in_RSI >> 0x38);
  v = (uint256 *)&stack0xffffffffffffffd8;
  GetRandHash();
  MakeByteSpan<uint256>(v);
  this_00 = &local_50;
  anon_unknown.dwarf_1a76e3f::GenerateRandomGarbage();
  ent32.m_size = (size_t)pCVar2;
  ent32.m_data = pbVar1;
  V2Transport(this_01,(NodeId)this_00,(bool)initiating_00,in_RDI,ent32,
              (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffffd0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)v);
  CKey::~CKey(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

V2Transport::V2Transport(NodeId nodeid, bool initiating) noexcept
    : V2Transport{nodeid, initiating, GenerateRandomKey(),
                  MakeByteSpan(GetRandHash()), GenerateRandomGarbage()} {}